

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O1

void KYBER_encap_external_entropy
               (uint8_t *out_ciphertext,uint8_t *out_shared_secret,KYBER_public_key *public_key,
               uint8_t *entropy)

{
  uint8_t prekey_and_randomness [64];
  uint8_t input [64];
  uint8_t auStack_b8 [32];
  uint8_t local_98 [32];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_78 = *(undefined8 *)entropy;
  uStack_70 = *(undefined8 *)(entropy + 8);
  local_68 = *(undefined8 *)(entropy + 0x10);
  uStack_60 = *(undefined8 *)(entropy + 0x18);
  local_58 = *(undefined8 *)((long)&public_key->opaque + 0x620);
  uStack_50 = *(undefined8 *)((long)&public_key->opaque + 0x628);
  local_48 = *(undefined8 *)((long)&public_key->opaque + 0x630);
  uStack_40 = *(undefined8 *)((long)&public_key->opaque + 0x638);
  BORINGSSL_keccak(auStack_b8,0x40,(uint8_t *)&local_78,0x40,boringssl_sha3_512);
  encrypt_cpa(out_ciphertext,(public_key *)public_key,entropy,local_98);
  BORINGSSL_keccak(local_98,0x20,out_ciphertext,0x440,boringssl_sha3_256);
  BORINGSSL_keccak(out_shared_secret,0x20,auStack_b8,0x40,boringssl_shake256);
  return;
}

Assistant:

void KYBER_encap_external_entropy(
    uint8_t out_ciphertext[KYBER_CIPHERTEXT_BYTES],
    uint8_t out_shared_secret[KYBER_SHARED_SECRET_BYTES],
    const struct KYBER_public_key *public_key,
    const uint8_t entropy[KYBER_ENCAP_ENTROPY]) {
  const struct public_key *pub = public_key_from_external(public_key);
  uint8_t input[64];
  OPENSSL_memcpy(input, entropy, KYBER_ENCAP_ENTROPY);
  OPENSSL_memcpy(input + KYBER_ENCAP_ENTROPY, pub->public_key_hash,
                 sizeof(input) - KYBER_ENCAP_ENTROPY);
  uint8_t prekey_and_randomness[64];
  hash_g(prekey_and_randomness, input, sizeof(input));
  encrypt_cpa(out_ciphertext, pub, entropy, prekey_and_randomness + 32);
  // The ciphertext is public.
  CONSTTIME_DECLASSIFY(out_ciphertext, KYBER_CIPHERTEXT_BYTES);
  hash_h(prekey_and_randomness + 32, out_ciphertext, KYBER_CIPHERTEXT_BYTES);
  kdf(out_shared_secret, KYBER_SHARED_SECRET_BYTES, prekey_and_randomness,
      sizeof(prekey_and_randomness));
}